

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerGLSL::remove_duplicate_swizzle(CompilerGLSL *this,string *op)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  string final_swiz;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar4 = ::std::__cxx11::string::rfind((char)op,0x2e);
  if (uVar4 + 1 < 2) {
    return false;
  }
  ::std::__cxx11::string::substr((ulong)&local_68,(ulong)op);
  if ((this->backend).swizzle_is_function == true) {
    if (1 < local_60) {
      ::std::__cxx11::string::substr((ulong)local_48,(ulong)&local_68);
      iVar3 = ::std::__cxx11::string::compare((char *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      if (iVar3 == 0) {
        if (local_60 < 2) {
          ::std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
          ;
          goto LAB_001bc6bc;
        }
        local_68[local_60 - 2] = 0;
        local_60 = local_60 - 2;
        goto LAB_001bc5a5;
      }
    }
  }
  else {
LAB_001bc5a5:
    if (local_60 != 0) {
      uVar7 = 0;
      do {
        if ((uVar7 == 4) || (local_68[uVar7] != "xyzw"[uVar7])) goto LAB_001bc683;
        uVar7 = uVar7 + 1;
      } while (local_60 != uVar7);
    }
    lVar5 = ::std::__cxx11::string::rfind((char)op,0x2e);
    if (lVar5 != -1) {
      uVar7 = lVar5 + 1;
      if (uVar7 < uVar4) {
        pcVar2 = (op->_M_dataplus)._M_p;
        do {
          cVar1 = pcVar2[lVar5 + 1];
          if ((byte)(cVar1 + 0x85U) < 0xfc) {
            bVar8 = false;
            if (((cVar1 != '(') || (bVar8 = false, (this->backend).swizzle_is_function == false)) ||
               (uVar4 - 3 != lVar5)) goto LAB_001bc685;
            if (pcVar2[lVar5 + 2] != ')') goto LAB_001bc683;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (uVar4 - 1 != lVar5);
      }
      bVar8 = true;
      if (local_60 <= uVar4 - uVar7) {
        uVar7 = local_60 + uVar7;
        if (op->_M_string_length < uVar7) {
LAB_001bc6bc:
          uVar6 = ::std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase");
          if (local_68 != local_58) {
            operator_delete(local_68);
          }
          _Unwind_Resume(uVar6);
        }
        op->_M_string_length = uVar7;
        (op->_M_dataplus)._M_p[uVar7] = '\0';
        if ((this->backend).swizzle_is_function == true) {
          ::std::__cxx11::string::append((char *)op);
        }
      }
      goto LAB_001bc685;
    }
  }
LAB_001bc683:
  bVar8 = false;
LAB_001bc685:
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return bVar8;
}

Assistant:

bool CompilerGLSL::remove_duplicate_swizzle(string &op)
{
	auto pos = op.find_last_of('.');
	if (pos == string::npos || pos == 0)
		return false;

	string final_swiz = op.substr(pos + 1, string::npos);

	if (backend.swizzle_is_function)
	{
		if (final_swiz.size() < 2)
			return false;

		if (final_swiz.substr(final_swiz.size() - 2, string::npos) == "()")
			final_swiz.erase(final_swiz.size() - 2, string::npos);
		else
			return false;
	}

	// Check if final swizzle is of form .x, .xy, .xyz, .xyzw or similar.
	// If so, and previous swizzle is of same length,
	// we can drop the final swizzle altogether.
	for (uint32_t i = 0; i < final_swiz.size(); i++)
	{
		static const char expected[] = { 'x', 'y', 'z', 'w' };
		if (i >= 4 || final_swiz[i] != expected[i])
			return false;
	}

	auto prevpos = op.find_last_of('.', pos - 1);
	if (prevpos == string::npos)
		return false;

	prevpos++;

	// Make sure there are only swizzles here ...
	for (auto i = prevpos; i < pos; i++)
	{
		if (op[i] < 'w' || op[i] > 'z')
		{
			// If swizzles are foo.xyz() like in C++ backend for example, check for that.
			if (backend.swizzle_is_function && i + 2 == pos && op[i] == '(' && op[i + 1] == ')')
				break;
			return false;
		}
	}

	// If original swizzle is large enough, just carve out the components we need.
	// E.g. foobar.wyx.xy will turn into foobar.wy.
	if (pos - prevpos >= final_swiz.size())
	{
		op.erase(prevpos + final_swiz.size(), string::npos);

		// Add back the function call ...
		if (backend.swizzle_is_function)
			op += "()";
	}
	return true;
}